

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

bool SearchHelper(ON_RTreeNode *a_node,ON_RTreeSphere *a_sphere,
                 ON_RTreeSearchResultCallback *a_result)

{
  double r_00;
  int iVar1;
  bool bVar2;
  double dVar3;
  double local_88;
  double closest_d;
  double sphere_radius;
  double r [6];
  ON_RTreeBranch *branch;
  double *sphere_center;
  int local_30;
  int count;
  int closest_i;
  int i;
  ON_RTreeSearchResultCallback *a_result_local;
  ON_RTreeSphere *a_sphere_local;
  ON_RTreeNode *a_node_local;
  
  iVar1 = a_node->m_count;
  if (0 < iVar1) {
    r[5] = (double)a_node->m_branch;
    r_00 = a_sphere->m_radius;
    local_30 = -1;
    local_88 = r_00;
    for (count = 0; count < iVar1; count = count + 1) {
      dVar3 = DistanceToBoxHelper(a_sphere->m_point,r_00,
                                  (ON_RTreeBBox *)((long)r[5] + (long)count * 0x38));
      r[(long)count + -1] = dVar3;
      if (r[(long)count + -1] <= local_88) {
        local_88 = r[(long)count + -1];
        local_30 = count;
      }
    }
    if (-1 < local_30) {
      bVar2 = ON_RTreeNode::IsInternalNode(a_node);
      if (bVar2) {
        bVar2 = SearchHelper(*(ON_RTreeNode **)((long)r[5] + (long)local_30 * 0x38 + 0x30),a_sphere,
                             a_result);
        if (!bVar2) {
          return false;
        }
        for (count = 0; count < iVar1; count = count + 1) {
          if (((count != local_30) && (r[(long)count + -1] <= a_sphere->m_radius)) &&
             (bVar2 = SearchHelper(*(ON_RTreeNode **)((long)r[5] + (long)count * 0x38 + 0x30),
                                   a_sphere,a_result), !bVar2)) {
            return false;
          }
        }
      }
      else {
        bVar2 = (*a_result->m_resultCallback)
                          (a_result->m_context,
                           *(ON__INT_PTR *)((long)r[5] + (long)local_30 * 0x38 + 0x30));
        if (!bVar2) {
          return false;
        }
        for (count = 0; count < iVar1; count = count + 1) {
          if (((count != local_30) && (r[(long)count + -1] <= a_sphere->m_radius)) &&
             (bVar2 = (*a_result->m_resultCallback)
                                (a_result->m_context,
                                 *(ON__INT_PTR *)((long)r[5] + (long)count * 0x38 + 0x30)), !bVar2))
          {
            return false;
          }
        }
      }
    }
  }
  return true;
}

Assistant:

static
bool SearchHelper(const ON_RTreeNode* a_node, struct ON_RTreeSphere* a_sphere, ON_RTreeSearchResultCallback& a_result ) 
{
  // NOTE: 
  //  Some versions of ON_RTree::Search shrink a_sphere as the search progresses.
  int i, closest_i, count;
  const double* sphere_center;
  const ON_RTreeBranch* branch;
  double r[ON_RTree_MAX_NODE_COUNT], sphere_radius, closest_d;
  
  if ( (count = a_node->m_count) > 0 )
  {
    branch = a_node->m_branch;
    sphere_center = a_sphere->m_point;
    sphere_radius = a_sphere->m_radius;
    closest_i = -1;
    closest_d = sphere_radius;

    for( i = 0; i < count; ++i )
    {
      // The radius parameter passed to DistanceToBoxHelper()
      // needs to be sphere_radius and not closest_d in order 
      // for the for() loops below to work correctly.
      r[i] = DistanceToBoxHelper( sphere_center, sphere_radius, &branch[i].m_rect );
      if ( r[i] <= closest_d )
      {
        closest_d = r[i];
        closest_i = i;
      }
    }

    // If all of the branches rectangles do not intersect the sphere,
    // then closest_i = -1.
    if ( closest_i >= 0 )
    {
      if(a_node->IsInternalNode()) 
      {
        // a_node is an internal node - search m_branch[].m_child as needed.
        // Search a closer node first to avoid worst case search times
        // in calculations where the calls to a_result.m_resultCallback()
        // reduce a_sphere->m_radius as results are found.  Closest point
        // calculations are an example.
        if ( !SearchHelper(branch[closest_i].m_child, a_sphere, a_result) )
        {
          // callback canceled search
          return false;
        }

        for( i = 0; i < count; ++i )
        {
          // Note that the calls to SearchHelper() can reduce the
          // value of a_sphere->m_radius.
          if( i != closest_i && r[i] <= a_sphere->m_radius )
          {
            if(!SearchHelper(branch[i].m_child, a_sphere, a_result) )
            {
              return false; // Don't continue searching
            }
          }
        }
      }
      else
      {
        // a_node is a leaf node - return m_branch[].m_id values
        // Search a closer node first to avoid worst case search times
        // in calculations where the calls to a_result.m_resultCallback()
        // reduce a_sphere->m_radius as results are found.  Closest point
        // calculations are an example.
        if ( !a_result.m_resultCallback( a_result.m_context, branch[closest_i].m_id ) ) 
        {
          // callback canceled search
          return false;
        }

        for( i = 0; i < count; ++i)
        {
          // Note that the calls to a_result.m_resultCallback() can reduce
          // the value of a_sphere->m_radius.
          if( i != closest_i && r[i] <= a_sphere->m_radius )
          {
            if ( !a_result.m_resultCallback( a_result.m_context, branch[i].m_id ) )
            {
              // callback canceled search
              return false;
            }
          }
        }
      }
    }
  }

  return true; // Continue searching
}